

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QList<QVariant> * subControlLayout(QList<QVariant> *__return_storage_ptr__,QByteArrayView layout)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QVariant *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (layout.m_size != 0) {
    lVar3 = 0;
    do {
      cVar1 = layout.m_data[lVar3];
      switch(cVar1) {
      case 'H':
        iVar2 = 0x48;
        break;
      case 'I':
        iVar2 = 0x49;
        break;
      case 'J':
      case 'K':
      case 'L':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'U':
      case 'V':
      case 'W':
switchD_00354c52_caseD_4a:
        iVar2 = (int)cVar1;
        break;
      case 'M':
        iVar2 = 0x44;
        break;
      case 'N':
        QVariant::QVariant(&QStack_58,0x40);
        QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                  ((QMovableArrayOps<QVariant> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&QStack_58);
        QList<QVariant>::end(__return_storage_ptr__);
        QVariant::~QVariant(&QStack_58);
        iVar2 = 0x47;
        break;
      case 'S':
        iVar2 = 0x45;
        break;
      case 'T':
        iVar2 = 0x41;
        break;
      case 'X':
        QVariant::QVariant(&QStack_58,0x3e);
        QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                  ((QMovableArrayOps<QVariant> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&QStack_58);
        QList<QVariant>::end(__return_storage_ptr__);
        QVariant::~QVariant(&QStack_58);
        iVar2 = 0x42;
        break;
      default:
        if (cVar1 != 'm') goto switchD_00354c52_caseD_4a;
        QVariant::QVariant(&QStack_58,0x3f);
        QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                  ((QMovableArrayOps<QVariant> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&QStack_58);
        QList<QVariant>::end(__return_storage_ptr__);
        QVariant::~QVariant(&QStack_58);
        iVar2 = 0x43;
      }
      QVariant::QVariant(&QStack_58,iVar2);
      QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                ((QMovableArrayOps<QVariant> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&QStack_58);
      QList<QVariant>::end(__return_storage_ptr__);
      QVariant::~QVariant(&QStack_58);
      lVar3 = lVar3 + 1;
    } while (layout.m_size != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QList<QVariant> subControlLayout(QByteArrayView layout)
{
    QList<QVariant> buttons;
    for (int button : layout) {
        switch (button) {
        case 'm':
            buttons.append(PseudoElement_MdiMinButton);
            buttons.append(PseudoElement_TitleBarMinButton);
            break;
        case 'M':
            buttons.append(PseudoElement_TitleBarMaxButton);
            break;
        case 'X':
            buttons.append(PseudoElement_MdiCloseButton);
            buttons.append(PseudoElement_TitleBarCloseButton);
            break;
        case 'N':
            buttons.append(PseudoElement_MdiNormalButton);
            buttons.append(PseudoElement_TitleBarNormalButton);
            break;
        case 'I':
            buttons.append(PseudoElement_TitleBarSysMenu);
            break;
        case 'T':
            buttons.append(PseudoElement_TitleBar);
            break;
        case 'H':
            buttons.append(PseudoElement_TitleBarContextHelpButton);
            break;
        case 'S':
            buttons.append(PseudoElement_TitleBarShadeButton);
            break;
        default:
            buttons.append(button);
            break;
        }
    }
    return buttons;
}